

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

char * __thiscall CaDiCaL::Parser::parse_string(Parser *this,char *str,char prev)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char in_DL;
  char *in_RSI;
  long in_RDI;
  char *p;
  char *local_28;
  char local_19;
  
  local_28 = in_RSI;
  local_19 = in_DL;
  while( true ) {
    if (*local_28 == '\0') {
      return (char *)0x0;
    }
    iVar2 = parse_char((Parser *)0xe02920);
    if (iVar2 != *local_28) break;
    local_19 = *local_28;
    local_28 = local_28 + 1;
  }
  if (*local_28 == ' ') {
    lVar1 = *(long *)(in_RDI + 8);
    File::name(*(File **)(in_RDI + 0x18));
    File::lineno(*(File **)(in_RDI + 0x18));
    Format::init((Format *)(lVar1 + 0x1c18),(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
    pcVar3 = Format::append((Format *)(*(long *)(in_RDI + 8) + 0x1c18),"expected space after \'%c\'"
                            ,(ulong)(uint)(int)local_19);
    return pcVar3;
  }
  lVar1 = *(long *)(in_RDI + 8);
  File::name(*(File **)(in_RDI + 0x18));
  File::lineno(*(File **)(in_RDI + 0x18));
  Format::init((Format *)(lVar1 + 0x1c18),(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
  pcVar3 = Format::append((Format *)(*(long *)(in_RDI + 8) + 0x1c18),"expected \'%c\' after \'%c\'",
                          (ulong)(uint)(int)*local_28,(ulong)(uint)(int)local_19);
  return pcVar3;
}

Assistant:

inline const char *Parser::parse_string (const char *str, char prev) {
  for (const char *p = str; *p; p++)
    if (parse_char () == *p)
      prev = *p;
    else if (*p == ' ')
      PER ("expected space after '%c'", prev);
    else
      PER ("expected '%c' after '%c'", *p, prev);
  return 0;
}